

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http2.c
# Opt level: O2

void h2_pri_spec(Curl_easy *data,nghttp2_priority_spec *pri_spec)

{
  int iVar1;
  Curl_easy *pCVar2;
  HTTP *pHVar3;
  int32_t *piVar4;
  Curl_data_prio_node *pCVar5;
  undefined4 uVar6;
  int32_t weight;
  int32_t stream_id;
  
  pCVar2 = (data->set).priority.parent;
  stream_id = 0;
  if (((pCVar2 != (Curl_easy *)0x0) &&
      (pHVar3 = (pCVar2->req).p.http, stream_id = 0, pHVar3 != (HTTP *)0x0)) &&
     (piVar4 = (int32_t *)pHVar3->h2_ctx, piVar4 != (int32_t *)0x0)) {
    stream_id = *piVar4;
  }
  iVar1 = (data->set).priority.weight;
  weight = 0x10;
  if (iVar1 != 0) {
    weight = iVar1;
  }
  nghttp2_priority_spec_init(pri_spec,stream_id,weight,(byte)(data->set).priority.field_0x14 & 1);
  uVar6 = *(undefined4 *)&(data->set).priority.field_0x14;
  (data->state).priority.weight = (data->set).priority.weight;
  *(undefined4 *)&(data->state).priority.field_0x14 = uVar6;
  pCVar5 = (data->set).priority.children;
  (data->state).priority.parent = (data->set).priority.parent;
  (data->state).priority.children = pCVar5;
  return;
}

Assistant:

static void h2_pri_spec(struct Curl_easy *data,
                        nghttp2_priority_spec *pri_spec)
{
  struct Curl_data_priority *prio = &data->set.priority;
  struct stream_ctx *depstream = H2_STREAM_CTX(prio->parent);
  int32_t depstream_id = depstream? depstream->id:0;
  nghttp2_priority_spec_init(pri_spec, depstream_id,
                             sweight_wanted(data),
                             data->set.priority.exclusive);
  data->state.priority = *prio;
}